

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svector.h
# Opt level: O0

void __thiscall
gmath::SVector<double,_6>::SVector
          (SVector<double,_6> *this,double v0,double v1,double v2,double v3,double v4,double v5)

{
  double v5_local;
  double v4_local;
  double v3_local;
  double v2_local;
  double v1_local;
  double v0_local;
  SVector<double,_6> *this_local;
  
  this->v[0] = v0;
  this->v[1] = v1;
  this->v[2] = v2;
  this->v[3] = v3;
  this->v[4] = v4;
  this->v[5] = v5;
  return;
}

Assistant:

SVector(T v0, T v1, T v2, T v3, T v4, T v5)
    {
      assert(n == 6);

      v[0]=v0;
      v[1]=v1;
      v[2]=v2;
      v[3]=v3;
      v[4]=v4;
      v[5]=v5;
    }